

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_ax(REF_INT rows,REF_DBL *a,REF_DBL *x,REF_DBL *ax)

{
  int local_30;
  int local_2c;
  REF_INT col;
  REF_INT row;
  REF_DBL *ax_local;
  REF_DBL *x_local;
  REF_DBL *a_local;
  REF_INT rows_local;
  
  for (local_2c = 0; local_2c < rows; local_2c = local_2c + 1) {
    ax[local_2c] = 0.0;
    for (local_30 = 0; local_30 < rows; local_30 = local_30 + 1) {
      ax[local_2c] = a[local_2c + rows * local_30] * x[local_30] + ax[local_2c];
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_ax(REF_INT rows, REF_DBL *a, REF_DBL *x,
                                 REF_DBL *ax) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    ax[row] = 0.0;
    for (col = 0; col < rows; col++) {
      ax[row] += a[row + rows * col] * x[col];
    }
  }
  return REF_SUCCESS;
}